

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Iterator<float,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++
          (Iterator<float,_true,_std::allocator<unsigned_long>_> *this)

{
  View<float,_true,_std::allocator<unsigned_long>_> *pVVar1;
  unsigned_long uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  reference pfVar6;
  pointer puVar7;
  size_t sVar8;
  
  marray_detail::Assert<bool>(this->view_ != (view_pointer)0x0);
  if (this->index_ < *(ulong *)(this->view_ + 0x30)) {
    this->index_ = this->index_ + 1;
    bVar3 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
    if (bVar3) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      if (this->index_ < *(ulong *)(pVVar1 + 0x30)) {
        View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar7 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(int *)(pVVar1 + 0x38) == 1) {
          for (sVar8 = 0;
              sVar8 < (ulong)((long)(this->coordinates_).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3);
              sVar8 = sVar8 + 1) {
            uVar2 = puVar7[sVar8];
            sVar4 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar8);
            sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar8);
            if (uVar2 != sVar4 - 1) goto LAB_0011edf5;
            puVar7 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar5 * puVar7[sVar8]);
            puVar7[sVar8] = 0;
          }
        }
        else {
          sVar8 = (long)(this->coordinates_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
          do {
            sVar8 = sVar8 - 1;
            uVar2 = puVar7[sVar8];
            sVar4 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar8);
            sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar8);
            if (uVar2 != sVar4 - 1) goto LAB_0011edf5;
            puVar7 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar5 * puVar7[sVar8]);
            puVar7[sVar8] = 0;
          } while (sVar8 != 0);
        }
      }
      else {
        pfVar6 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                           (pVVar1,*(ulong *)(pVVar1 + 0x30) - 1);
        this->pointer_ = pfVar6 + 1;
        pVVar1 = this->view_;
        View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if (*(int *)(pVVar1 + 0x38) == 1) {
          puVar7 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar7 = *puVar7 + 1;
        }
        else {
          sVar8 = View<float,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
          puVar7 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (sVar8 - 1);
          *puVar7 = *puVar7 + 1;
        }
      }
    }
  }
LAB_0011ecde:
  testInvariant(this);
  return this;
LAB_0011edf5:
  this->pointer_ = this->pointer_ + sVar5;
  puVar7 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + sVar8;
  *puVar7 = *puVar7 + 1;
  goto LAB_0011ecde;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}